

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

void delay_timer_cb(uv_timer_t *timer)

{
  void *pvVar1;
  int iVar2;
  int r;
  connection_context_t *context;
  uv_timer_t *timer_local;
  
  pvVar1 = timer->data;
  iVar2 = uv_is_active(timer);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
            ,0x1ae,"0 == uv_is_active((uv_handle_t*) timer)");
    abort();
  }
  if (*(int *)((long)pvVar1 + 0x168) == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
            ,0x1b1,"context->delayed_events != 0");
    abort();
  }
  *(uint *)((long)pvVar1 + 0x164) =
       *(uint *)((long)pvVar1 + 0x168) | *(uint *)((long)pvVar1 + 0x164);
  *(undefined4 *)((long)pvVar1 + 0x168) = 0;
  iVar2 = uv_poll_start(pvVar1,*(undefined4 *)((long)pvVar1 + 0x164),connection_poll_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
            ,0x1b8,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void delay_timer_cb(uv_timer_t* timer) {
  connection_context_t* context = (connection_context_t*) timer->data;
  int r;

  /* Timer should auto stop. */
  ASSERT(0 == uv_is_active((uv_handle_t*) timer));

  /* Add the requested events to the poll mask. */
  ASSERT(context->delayed_events != 0);
  context->events |= context->delayed_events;
  context->delayed_events = 0;

  r = uv_poll_start(&context->poll_handle,
                    context->events,
                    connection_poll_cb);
  ASSERT(r == 0);
}